

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O1

string * bloaty::RangeMap::EntryDebugString
                   (string *__return_storage_ptr__,uint64_t addr,uint64_t size,uint64_t other_start,
                   string *label)

{
  uint64_t uVar1;
  AlphaNum *b;
  Hex hex;
  Hex hex_00;
  Hex hex_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  string end;
  char *local_178;
  char *pcStack_170;
  long local_168 [2];
  long *local_158;
  long lStack_150;
  long local_148 [2];
  AlphaNum local_138;
  AlphaNum local_100;
  undefined1 local_d0 [16];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  uVar1 = other_start;
  if (size == 0xffffffffffffffff) {
    end._M_dataplus._M_p = (pointer)&end.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&end,"?","");
  }
  else {
    local_158 = local_148;
    local_148[1] = 0;
    lStack_150 = 0;
    local_148[0] = 0;
    hex._8_8_ = other_start;
    hex.value = 0x3001;
    absl::AbslStringify<absl::strings_internal::StringifySink>
              ((absl *)&local_158,(StringifySink *)(size + addr),hex);
    end._M_dataplus._M_p = (pointer)&end.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&end,local_158,lStack_150 + (long)local_158);
    if (local_158 != local_148) {
      operator_delete(local_158,local_148[0] + 1);
    }
  }
  local_100.piece_._M_len = 1;
  local_100.piece_._M_str = "[";
  local_168[1] = 0;
  pcStack_170 = (char *)0x0;
  local_168[0] = 0;
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1869f6;
  hex_00.width = (char)uVar1;
  hex_00.fill = (char)(uVar1 >> 8);
  hex_00._10_6_ = (int6)(uVar1 >> 0x10);
  hex_00.value = 0x3001;
  local_178 = (char *)local_168;
  absl::AbslStringify<absl::strings_internal::StringifySink>
            ((absl *)&local_178,(StringifySink *)addr,hex_00);
  local_c0.piece_._M_len = (size_t)pcStack_170;
  local_c0.piece_._M_str = local_178;
  b = &local_138;
  local_138.piece_._M_len = 2;
  local_138.piece_._M_str = ", ";
  local_60.piece_._M_len = end._M_string_length;
  local_60.piece_._M_str = end._M_dataplus._M_p;
  local_90.piece_._M_len = 8;
  local_90.piece_._M_str = "] (size=";
  local_d0._8_2_ = 0x3001;
  local_d0._0_8_ = size;
  absl::StrCat<absl::Hex,char[4],std::__cxx11::string>
            (__return_storage_ptr__,(absl *)&local_100,&local_c0,b,&local_60,&local_90,
             (AlphaNum *)local_d0,(Hex *)0x5a8924,(char (*) [4])label,args_2);
  if ((long *)local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (other_start != 0xffffffffffffffff) {
    local_100.piece_._M_len = 0xe;
    local_100.piece_._M_str = ", other_start=";
    local_138.digits_[8] = '\0';
    local_138.digits_[9] = '\0';
    local_138.digits_[10] = '\0';
    local_138.digits_[0xb] = '\0';
    local_138.digits_[0xc] = '\0';
    local_138.digits_[0xd] = '\0';
    local_138.digits_[0xe] = '\0';
    local_138.digits_[0xf] = '\0';
    local_138.piece_._M_str = (char *)0x0;
    local_138.digits_[0] = '\0';
    local_138.digits_[1] = '\0';
    local_138.digits_[2] = '\0';
    local_138.digits_[3] = '\0';
    local_138.digits_[4] = '\0';
    local_138.digits_[5] = '\0';
    local_138.digits_[6] = '\0';
    local_138.digits_[7] = '\0';
    hex_01._8_8_ = b;
    hex_01.value = 0x3001;
    local_138.piece_._M_len = (size_t)local_138.digits_;
    absl::AbslStringify<absl::strings_internal::StringifySink>
              ((absl *)&local_138,(StringifySink *)other_start,hex_01);
    local_c0.piece_._M_len = (size_t)local_138.piece_._M_str;
    local_c0.piece_._M_str = (char *)local_138.piece_._M_len;
    absl::StrAppend(__return_storage_ptr__,&local_100,&local_c0);
    if ((char *)local_138.piece_._M_len != local_138.digits_) {
      operator_delete((void *)local_138.piece_._M_len,local_138.digits_._0_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)end._M_dataplus._M_p != &end.field_2) {
    operator_delete(end._M_dataplus._M_p,end.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string EntryDebugString(uint64_t addr, uint64_t size,
                                      uint64_t other_start,
                                      const std::string& label) {
    std::string end =
        size == kUnknownSize ? "?" : absl::StrCat(absl::Hex(addr + size));
    std::string ret = absl::StrCat("[", absl::Hex(addr), ", ", end,
                                   "] (size=", absl::Hex(size), "): ", label);
    if (other_start != UINT64_MAX) {
      absl::StrAppend(&ret, ", other_start=", absl::Hex(other_start));
    }
    return ret;
  }